

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O0

void vkt::sparse::submitCommandsAndWait
               (DeviceInterface *vk,VkDevice device,VkQueue queue,VkCommandBuffer commandBuffer,
               deUint32 waitSemaphoreCount,VkSemaphore *pWaitSemaphores,
               VkPipelineStageFlags *pWaitDstStageMask,deUint32 signalSemaphoreCount,
               VkSemaphore *pSignalSemaphores)

{
  RefData<vk::Handle<(vk::HandleType)6>_> data;
  VkCommandBuffer pVVar1;
  VkQueue pVVar2;
  VkDevice pVVar3;
  VkResult VVar4;
  Handle<(vk::HandleType)6> *pHVar5;
  undefined4 local_110 [2];
  VkSubmitInfo submitInfo;
  Move<vk::Handle<(vk::HandleType)6>_> local_b8;
  RefData<vk::Handle<(vk::HandleType)6>_> local_98;
  undefined1 local_78 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> fence;
  VkFenceCreateInfo fenceParams;
  VkSemaphore *pWaitSemaphores_local;
  VkCommandBuffer pVStack_28;
  deUint32 waitSemaphoreCount_local;
  VkCommandBuffer commandBuffer_local;
  VkQueue queue_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x8;
  pVStack_28 = commandBuffer;
  commandBuffer_local = (VkCommandBuffer)queue;
  queue_local = (VkQueue)device;
  device_local = (VkDevice)vk;
  ::vk::createFence(&local_b8,vk,device,
                    (VkFenceCreateInfo *)
                    &fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator,
                    (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_98,(Move *)&local_b8);
  data.deleter.m_deviceIface = local_98.deleter.m_deviceIface;
  data.object.m_internal = local_98.object.m_internal;
  data.deleter.m_device = local_98.deleter.m_device;
  data.deleter.m_allocator = local_98.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_78,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&local_b8);
  pVVar3 = device_local;
  pVVar1 = commandBuffer_local;
  local_110[0] = 4;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)pWaitDstStageMask;
  submitInfo.pWaitDstStageMask._0_4_ = 1;
  submitInfo._40_8_ = &stack0xffffffffffffffd8;
  submitInfo.pCommandBuffers._0_4_ = signalSemaphoreCount;
  submitInfo._56_8_ = pSignalSemaphores;
  submitInfo.pNext._0_4_ = waitSemaphoreCount;
  submitInfo._16_8_ = pWaitSemaphores;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_78);
  VVar4 = (**(code **)(*(long *)pVVar3 + 0x10))(pVVar3,pVVar1,1,local_110,pHVar5->m_internal);
  ::vk::checkResult(VVar4,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesTestsUtil.cpp"
                    ,0x231);
  pVVar3 = device_local;
  pVVar2 = queue_local;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_78);
  VVar4 = (**(code **)(*(long *)pVVar3 + 0xb0))(pVVar3,pVVar2,1,pHVar5,1,0xffffffffffffffff);
  ::vk::checkResult(VVar4,"vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesTestsUtil.cpp"
                    ,0x232);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_78);
  return;
}

Assistant:

void submitCommandsAndWait (const DeviceInterface&		vk,
							const VkDevice				device,
							const VkQueue				queue,
							const VkCommandBuffer		commandBuffer,
							const deUint32				waitSemaphoreCount,
							const VkSemaphore*			pWaitSemaphores,
							const VkPipelineStageFlags*	pWaitDstStageMask,
							const deUint32				signalSemaphoreCount,
							const VkSemaphore*			pSignalSemaphores)
{
	const VkFenceCreateInfo	fenceParams =
	{
		VK_STRUCTURE_TYPE_FENCE_CREATE_INFO,	// VkStructureType		sType;
		DE_NULL,								// const void*			pNext;
		0u,										// VkFenceCreateFlags	flags;
	};
	const Unique<VkFence> fence(createFence(vk, device, &fenceParams));

	const VkSubmitInfo submitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,		// VkStructureType				sType;
		DE_NULL,							// const void*					pNext;
		waitSemaphoreCount,					// deUint32						waitSemaphoreCount;
		pWaitSemaphores,					// const VkSemaphore*			pWaitSemaphores;
		pWaitDstStageMask,					// const VkPipelineStageFlags*	pWaitDstStageMask;
		1u,									// deUint32						commandBufferCount;
		&commandBuffer,						// const VkCommandBuffer*		pCommandBuffers;
		signalSemaphoreCount,				// deUint32						signalSemaphoreCount;
		pSignalSemaphores,					// const VkSemaphore*			pSignalSemaphores;
	};

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
	VK_CHECK(vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull));
}